

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_2d3845::ValueSetter::handleEOF(ValueSetter *this)

{
  size_t in_RCX;
  void *__buf;
  long *local_38 [2];
  long local_28 [2];
  
  if (this->replaced == false) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"/Tx BMC\n","");
    QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)local_38,__buf,in_RCX);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    writeAppearance(this);
  }
  return;
}

Assistant:

void
ValueSetter::handleEOF()
{
    if (!this->replaced) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper replaced BMC at EOF");
        write("/Tx BMC\n");
        writeAppearance();
    }
}